

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O1

void __thiscall
icu_63::ZNames::ZNamesLoader::loadTimeZone
          (ZNamesLoader *this,UResourceBundle *zoneStrings,UnicodeString *tzID,UErrorCode *errorCode
          )

{
  uint uVar1;
  undefined8 uVar2;
  undefined4 length;
  ulong uVar3;
  UErrorCode localStatus;
  UnicodeString uKey;
  char key [129];
  UErrorCode local_fc;
  UnicodeString local_f8;
  char local_b8 [136];
  
  UnicodeString::UnicodeString(&local_f8,tzID);
  uVar1 = (uint)local_f8.fUnion.fStackFields.fLengthAndFlags;
  length = local_f8.fUnion.fFields.fLength;
  if (-1 < local_f8.fUnion.fStackFields.fLengthAndFlags) {
    length = (int)uVar1 >> 5;
  }
  if (0 < (int)length) {
    uVar3 = 0;
    do {
      if (uVar3 < (uint)length) {
        uVar2 = local_f8.fUnion.fStackFields.fBuffer;
        if ((uVar1 & 2) == 0) {
          uVar2 = local_f8.fUnion.fFields.fArray;
        }
        if (*(char16_t *)(uVar2 + uVar3 * 2) == L'/') {
          UnicodeString::setCharAt(&local_f8,(int32_t)uVar3,L':');
        }
      }
      uVar1 = (uint)local_f8.fUnion.fStackFields.fLengthAndFlags;
      length = local_f8.fUnion.fFields.fLength;
      if (-1 < local_f8.fUnion.fStackFields.fLengthAndFlags) {
        length = (int)uVar1 >> 5;
      }
      uVar3 = uVar3 + 1;
    } while ((long)uVar3 < (long)(int)length);
  }
  UnicodeString::extract(&local_f8,0,length,local_b8,0x81,kInvariant);
  local_fc = U_ZERO_ERROR;
  this->names[4] = (UChar *)0x0;
  this->names[5] = (UChar *)0x0;
  this->names[2] = (UChar *)0x0;
  this->names[3] = (UChar *)0x0;
  this->names[0] = (UChar *)0x0;
  this->names[1] = (UChar *)0x0;
  this->names[6] = (UChar *)0x0;
  ures_getAllItemsWithFallback_63(zoneStrings,local_b8,&this->super_ResourceSink,&local_fc);
  if (local_fc < U_ILLEGAL_ARGUMENT_ERROR) {
    *errorCode = local_fc;
  }
  UnicodeString::~UnicodeString(&local_f8);
  return;
}

Assistant:

void loadTimeZone(const UResourceBundle* zoneStrings, const UnicodeString& tzID, UErrorCode& errorCode) {
        // Replace "/" with ":".
        UnicodeString uKey(tzID);
        for (int32_t i = 0; i < uKey.length(); i++) {
            if (uKey.charAt(i) == (UChar)0x2F) {
                uKey.setCharAt(i, (UChar)0x3A);
            }
        }

        char key[ZID_KEY_MAX + 1];
        uKey.extract(0, uKey.length(), key, sizeof(key), US_INV);

        loadNames(zoneStrings, key, errorCode);
    }